

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O1

int raplcap_pd_set_limit
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_constraint constraint
              ,raplcap_limit *limit)

{
  uint32_t die_00;
  int iVar1;
  raplcap_msr *ctx;
  int *piVar2;
  raplcap_limit *limit_long;
  raplcap_msr_sys_ctx *prVar3;
  raplcap_limit *limit_short;
  off_t msr;
  uint64_t msrval;
  uint64_t local_48;
  uint32_t local_3c;
  raplcap_limit *local_38;
  
  local_3c = die;
  local_38 = limit;
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    msr = ZONE_OFFSETS_PL[zone];
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    msr = -1;
  }
  die_00 = local_3c;
  iVar1 = -1;
  if (-1 < msr && ctx != (raplcap_msr *)0x0) {
    if (constraint < (RAPLCAP_CONSTRAINT_PEAK_POWER|RAPLCAP_CONSTRAINT_SHORT_TERM)) {
      prVar3 = ctx->sys;
      if (constraint == RAPLCAP_CONSTRAINT_PEAK_POWER) {
        iVar1 = msr_sys_read(prVar3,&local_48,pkg,local_3c,0x601);
        if (iVar1 != 0) {
          return -1;
        }
        if (local_38 == (raplcap_limit *)0x0) {
          return 0;
        }
        local_48 = msr_set_pl4_limit(&ctx->ctx,zone,local_48,local_38->watts);
        prVar3 = ctx->sys;
        msr = 0x601;
      }
      else {
        if (constraint == RAPLCAP_CONSTRAINT_SHORT_TERM) {
          iVar1 = msr_sys_read(prVar3,&local_48,pkg,local_3c,msr);
          if (iVar1 != 0) {
            return -1;
          }
          limit_long = (raplcap_limit *)0x0;
          limit_short = local_38;
        }
        else {
          iVar1 = msr_sys_read(prVar3,&local_48,pkg,local_3c,msr);
          if (iVar1 != 0) {
            return -1;
          }
          limit_short = (raplcap_limit *)0x0;
          limit_long = local_38;
        }
        local_48 = msr_set_limits(&ctx->ctx,zone,local_48,limit_long,limit_short);
        prVar3 = ctx->sys;
      }
      iVar1 = msr_sys_write(prVar3,local_48,pkg,die_00,msr);
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
    }
  }
  return iVar1;
}

Assistant:

int raplcap_pd_set_limit(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                         raplcap_constraint constraint, const raplcap_limit* limit) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  int ret = 0;
  raplcap_log(DEBUG, "raplcap_pd_set_limit: pkg=%"PRIu32", die=%"PRIu32", zone=%d, constraint=%d\n",
              pkg, die, zone, constraint);
  if (state == NULL || msr < 0) {
    return -1;
  }
  if ((int) constraint < 0 || (int) constraint >= RAPLCAP_NCONSTRAINTS) {
    errno = EINVAL;
    return -1;
  }
  switch (constraint) {
    case RAPLCAP_CONSTRAINT_LONG_TERM:
      if (msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
        return -1;
      }
      msrval = msr_set_limits(&state->ctx, zone, msrval, limit, NULL);
      ret = msr_sys_write(state->sys, msrval, pkg, die, msr);
      break;
    case RAPLCAP_CONSTRAINT_SHORT_TERM:
      if (msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
        return -1;
      }
      msrval = msr_set_limits(&state->ctx, zone, msrval, NULL, limit);
      ret = msr_sys_write(state->sys, msrval, pkg, die, msr);
      break;
    case RAPLCAP_CONSTRAINT_PEAK_POWER:
      if (msr_sys_read(state->sys, &msrval, pkg, die, MSR_VR_CURRENT_CONFIG)) {
        return -1;
      }
      if (limit) {
        msrval = msr_set_pl4_limit(&state->ctx, zone, msrval, limit->watts);
        ret = msr_sys_write(state->sys, msrval, pkg, die, MSR_VR_CURRENT_CONFIG);
      }
      break;
    default:
      // unreachable
      errno = EINVAL;
      ret = -1;
      break;
  }
  return ret;
}